

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::StringTree> * __thiscall
kj::ArrayBuilder<kj::StringTree>::finish(ArrayBuilder<kj::StringTree> *this)

{
  StringTree *pSVar1;
  RemoveConst<kj::StringTree> *pRVar2;
  ArrayDisposer *pAVar3;
  Array<kj::StringTree> *in_RDI;
  Array<kj::StringTree> *result;
  
  pSVar1 = this->ptr;
  pRVar2 = this->pos;
  pAVar3 = this->disposer;
  in_RDI->ptr = pSVar1;
  in_RDI->size_ = ((long)pRVar2 - (long)pSVar1) / 0x38;
  in_RDI->disposer = pAVar3;
  this->ptr = (StringTree *)0x0;
  this->pos = (RemoveConst<kj::StringTree> *)0x0;
  this->endPtr = (StringTree *)0x0;
  return in_RDI;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }